

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool operator_float_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double dVar1;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_class_t *pgVar3;
  gravity_value_t value;
  gravity_value_t gVar4;
  char _buffer [4096];
  char local_1028 [4104];
  
  dVar1 = (args->field_1).f;
  gVar4 = convert_value2float(vm,args[1]);
  aVar2 = gVar4.field_1;
  if (gVar4.isa == (gravity_class_t *)0x0) {
    builtin_strncpy(local_1028,"Unable to convert object to Float",0x22);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    pgVar3 = gravity_class_null;
  }
  else {
    pgVar3 = gravity_class_int;
    if ((dVar1 != aVar2.f) || (NAN(dVar1) || NAN(aVar2.f))) {
      if (dVar1 <= aVar2.f) {
        aVar2.n = -1;
      }
      else {
        aVar2.n = 1;
      }
      goto LAB_0011d844;
    }
  }
  aVar2.n = 0;
LAB_0011d844:
  value.field_1.n = aVar2.n;
  value.isa = pgVar3;
  gravity_vm_setslot(vm,value,rindex);
  return gVar4.isa != (gravity_class_t *)0x0;
}

Assistant:

static bool operator_float_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v2, true);
    
    // simpler equality test
    if (VALUE_ISA_VALID(v2)) {
        if (v1.f == v2.f) RETURN_VALUE(VALUE_FROM_INT(0), rindex);
        if (v1.f > v2.f) RETURN_VALUE(VALUE_FROM_INT(1), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}